

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O0

void ExtractPublicDependencies
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *components)

{
  bool bVar1;
  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
  *this;
  pair<std::__detail::_Node_iterator<Component_*,_true,_false>,_bool> pVar2;
  File **dep;
  iterator __end4;
  iterator __begin4;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_> *__range4
  ;
  File **fp;
  iterator __end2;
  iterator __begin2;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_> *__range2
  ;
  Component *comp;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>
  *c;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *in_stack_ffffffffffffff78;
  _Node_iterator_base<Component_*,_false> in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  _Node_iterator_base<File_*,_false> local_68;
  _Node_iterator_base<File_*,_false> local_60;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_> *local_58
  ;
  reference local_50;
  _Node_iterator_base<File_*,_false> local_48;
  _Node_iterator_base<File_*,_false> local_40;
  unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_> *local_38
  ;
  Component *local_30;
  reference local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  local_20;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
  local_18 [3];
  
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
       ::begin(in_stack_ffffffffffffff78);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
       ::end(in_stack_ffffffffffffff78);
  while (bVar1 = std::__detail::operator!=(local_18,&local_20), bVar1) {
    local_28 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
               ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                            *)0x19795c);
    local_30 = local_28->second;
    local_38 = &local_30->files;
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>::
         begin((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                *)in_stack_ffffffffffffff78);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>::
         end((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
              *)in_stack_ffffffffffffff78);
    while (bVar1 = std::__detail::operator!=(&local_40,&local_48), bVar1) {
      local_50 = std::__detail::_Node_iterator<File_*,_true,_false>::operator*
                           ((_Node_iterator<File_*,_true,_false> *)0x1979bf);
      if (((*local_50)->hasExternalInclude & 1U) != 0) {
        local_58 = &(*local_50)->dependencies;
        local_60._M_cur =
             (__node_type *)
             std::
             unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
             ::begin((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                      *)in_stack_ffffffffffffff78);
        local_68._M_cur =
             (__node_type *)
             std::
             unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
             ::end((unordered_set<File_*,_std::hash<File_*>,_std::equal_to<File_*>,_std::allocator<File_*>_>
                    *)in_stack_ffffffffffffff78);
        while (bVar1 = std::__detail::operator!=(&local_60,&local_68), bVar1) {
          this = (unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                  *)std::__detail::_Node_iterator<File_*,_true,_false>::operator*
                              ((_Node_iterator<File_*,_true,_false> *)0x197a27);
          std::
          unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
          ::erase((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                   *)in_stack_ffffffffffffff80._M_cur,(key_type *)in_stack_ffffffffffffff78);
          pVar2 = std::
                  unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
                  ::insert(this,(value_type *)
                                CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88));
          in_stack_ffffffffffffff80._M_cur =
               (__node_type *)pVar2.first.super__Node_iterator_base<Component_*,_false>._M_cur;
          in_stack_ffffffffffffff88 = pVar2.second;
          std::__detail::_Node_iterator<File_*,_true,_false>::operator++
                    ((_Node_iterator<File_*,_true,_false> *)in_stack_ffffffffffffff80._M_cur);
        }
      }
      std::__detail::_Node_iterator<File_*,_true,_false>::operator++
                ((_Node_iterator<File_*,_true,_false> *)in_stack_ffffffffffffff80._M_cur);
    }
    std::
    unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
    ::erase((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
             *)in_stack_ffffffffffffff80._M_cur,(key_type *)in_stack_ffffffffffffff78);
    std::
    unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
    ::erase((unordered_set<Component_*,_std::hash<Component_*>,_std::equal_to<Component_*>,_std::allocator<Component_*>_>
             *)in_stack_ffffffffffffff80._M_cur,(key_type *)in_stack_ffffffffffffff78);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_false,_true>
                  *)in_stack_ffffffffffffff80._M_cur);
  }
  return;
}

Assistant:

void ExtractPublicDependencies(std::unordered_map<std::string, Component *> &components) {
    for (auto &c : components) {
        Component *comp = c.second;
        for (auto &fp : comp->files) {
            if (fp->hasExternalInclude) {
                for (auto &dep : fp->dependencies) {
                    comp->privDeps.erase(dep->component);
                    comp->pubDeps.insert(dep->component);
                }
            }
        }
        comp->pubDeps.erase(comp);
        comp->privDeps.erase(comp);
    }
}